

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate1<float>::apply
          (QGate1<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,int offset)

{
  float fVar1;
  SquareMatrix<float> *rhs;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  _Head_base<0UL,_float_*,_false> _Var5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  uint uVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  int64_t k;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  SquareMatrix<float> local_70;
  SquareMatrix<float> *local_60;
  SquareMatrix<float> local_58;
  SquareMatrix<float> local_48;
  long local_38;
  
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  local_60 = matrix;
  iVar2 = (*(this->super_QObject<float>)._vptr_QObject[3])();
  uVar3 = iVar2 + offset;
  if (nbQubits <= (int)uVar3) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  (*(this->super_QObject<float>)._vptr_QObject[7])(&local_70);
  rhs = local_60;
  if ((op != NoTrans) && (1 < local_70.size_)) {
    pfVar10 = (float *)((long)local_70.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl +
                       local_70.size_ * 4);
    _Var5._M_head_impl = (float *)local_70.data_;
    lVar13 = 0;
    do {
      lVar16 = 1;
      pfVar4 = pfVar10;
      do {
        fVar22 = _Var5._M_head_impl[lVar16];
        _Var5._M_head_impl[lVar16] = *pfVar4;
        *pfVar4 = fVar22;
        lVar14 = lVar13 + lVar16;
        lVar16 = lVar16 + 1;
        pfVar4 = pfVar4 + local_70.size_;
      } while (lVar14 + 1 < local_70.size_);
      pfVar10 = pfVar10 + local_70.size_ + 1;
      _Var5._M_head_impl = _Var5._M_head_impl + local_70.size_ + 1;
      bVar21 = lVar13 != local_70.size_ + -2;
      lVar13 = lVar13 + 1;
    } while (bVar21);
  }
  if (side == Left) {
    if (nbQubits == 1) {
      lVar13 = local_60->size_;
      if (lVar13 != local_70.size_) {
        __assert_fail("size_ == rhs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                      ,0xb0,
                      "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator*=(const SquareMatrix<T> &) [T = float]"
                     );
      }
      if (lVar13 == 0) {
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                      ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = float]");
      }
      uVar7 = 0xffffffffffffffff;
      if ((ulong)(lVar13 * lVar13) >> 0x3e == 0) {
        uVar7 = lVar13 * lVar13 * 4;
      }
      pfVar4 = (float *)operator_new__(uVar7);
      memset(pfVar4,0,uVar7);
      pfVar10 = (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                super__Head_base<0UL,_float_*,_false>._M_head_impl;
      if (lVar13 < 1) {
        (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
        if (pfVar10 == (float *)0x0) goto LAB_0010f76d;
      }
      else {
        lVar16 = 0;
        _Var5._M_head_impl =
             (float *)local_70.data_._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
        do {
          lVar14 = 0;
          pfVar12 = pfVar10;
          do {
            fVar22 = pfVar4[lVar16 * lVar13 + lVar14];
            lVar17 = 0;
            pfVar15 = pfVar12;
            do {
              fVar22 = fVar22 + *pfVar15 * _Var5._M_head_impl[lVar17];
              pfVar4[lVar16 * lVar13 + lVar14] = fVar22;
              lVar17 = lVar17 + 1;
              pfVar15 = pfVar15 + lVar13;
            } while (lVar13 != lVar17);
            lVar14 = lVar14 + 1;
            pfVar12 = pfVar12 + 1;
          } while (lVar14 != lVar13);
          lVar16 = lVar16 + 1;
          _Var5._M_head_impl = _Var5._M_head_impl + lVar13;
        } while (lVar16 != lVar13);
        (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
      }
      operator_delete__(pfVar10);
    }
    else {
      lVar13 = local_60->size_;
      if (0 < lVar13) {
        lVar14 = (long)(1 << ((byte)(~uVar3 + nbQubits) & 0x1f));
        uVar11 = 1 << ((byte)uVar3 & 0x1f);
        lVar16 = 1;
        if (1 < lVar14) {
          lVar16 = lVar14;
        }
        if ((int)uVar11 < 2) {
          uVar11 = 1;
        }
        local_38 = lVar14 * lVar13 * 4;
        lVar17 = 0;
        lVar18 = 0;
        do {
          if (uVar3 != 0x1f) {
            pfVar10 = (local_60->data_)._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
            uVar7 = 0;
            do {
              lVar6 = lVar16;
              pfVar4 = pfVar10;
              if (~uVar3 + nbQubits != 0x1f) {
                do {
                  fVar22 = *(float *)((long)pfVar4 + lVar17);
                  fVar1 = *(float *)((long)pfVar4 + local_38 + lVar17);
                  *(float *)((long)pfVar4 + lVar17) =
                       *(float *)local_70.data_._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl * fVar22 +
                       *(float *)((long)local_70.data_._M_t.
                                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                        .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4) *
                       fVar1;
                  *(float *)((long)pfVar4 + local_38 + lVar17) =
                       fVar22 * *(float *)((long)local_70.data_._M_t.
                                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                 .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                          + local_70.size_ * 4) +
                       fVar1 * ((float *)
                               ((long)local_70.data_._M_t.
                                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                      .super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                               [local_70.size_];
                  pfVar4 = pfVar4 + lVar13;
                  lVar6 = lVar6 + -1;
                } while (lVar6 != 0);
              }
              uVar7 = uVar7 + 1;
              pfVar10 = pfVar10 + lVar14 * lVar13 * 2;
            } while (uVar7 != uVar11);
          }
          lVar18 = lVar18 + 1;
          lVar17 = lVar17 + 4;
        } while (lVar18 != lVar13);
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<float>::SquareMatrix(&local_58,&local_70);
    dense::operator*((dense *)&local_48,&local_58,rhs);
    dense::SquareMatrix<float>::operator=(rhs,&local_48);
    if (local_48.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
      operator_delete__((void *)local_48.data_._M_t.
                                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                super__Head_base<0UL,_float_*,_false>._M_head_impl);
    }
    local_48.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
    if ((tuple<float_*,_std::default_delete<float[]>_>)
        local_58.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0)
    {
      operator_delete__((void *)local_58.data_._M_t.
                                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                super__Head_base<0UL,_float_*,_false>._M_head_impl);
    }
    local_58.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  }
  else {
    lVar13 = local_60->size_;
    if (0 < lVar13) {
      lVar14 = (long)(1 << ((byte)(~uVar3 + nbQubits) & 0x1f));
      uVar11 = 1 << ((byte)uVar3 & 0x1f);
      lVar16 = 1;
      if (1 < lVar14) {
        lVar16 = lVar14;
      }
      uVar7 = (ulong)uVar11;
      if ((int)uVar11 < 2) {
        uVar7 = 1;
      }
      lVar17 = lVar14 * 4;
      lVar18 = 0;
      lVar6 = 0;
      do {
        if (uVar3 != 0x1f) {
          pfVar10 = (local_60->data_)._M_t.
                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
          lVar19 = (long)pfVar10 + lVar17;
          lVar20 = (long)pfVar10 + lVar18;
          uVar8 = 0;
          do {
            if (~uVar3 + nbQubits != 0x1f) {
              lVar9 = 0;
              do {
                fVar22 = *(float *)(lVar20 + lVar9 * 4);
                fVar1 = *(float *)(lVar19 + lVar9 * 4);
                *(float *)(lVar20 + lVar9 * 4) =
                     *(float *)local_70.data_._M_t.
                               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                               super__Head_base<0UL,_float_*,_false>._M_head_impl * fVar22 +
                     *(float *)((long)local_70.data_._M_t.
                                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                      .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                               local_70.size_ * 4) * fVar1;
                *(float *)(lVar19 + lVar9 * 4) =
                     fVar22 * *(float *)((long)local_70.data_._M_t.
                                               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                               .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                        4) +
                     fVar1 * ((float *)
                             ((long)local_70.data_._M_t.
                                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                                    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                    super__Head_base<0UL,_float_*,_false>._M_head_impl + 4))
                             [local_70.size_];
                lVar9 = lVar9 + 1;
              } while (lVar16 != lVar9);
            }
            uVar8 = uVar8 + 1;
            lVar19 = lVar19 + lVar14 * 8;
            lVar20 = lVar20 + lVar14 * 8;
          } while (uVar8 != uVar7);
        }
        lVar6 = lVar6 + 1;
        lVar17 = lVar17 + lVar13 * 4;
        lVar18 = lVar18 + lVar13 * 4;
      } while (lVar6 != lVar13);
    }
  }
LAB_0010f76d:
  if ((_Head_base<0UL,_float_*,_false>)
      local_70.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0) {
    operator_delete__((void *)local_70.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }